

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode.c
# Opt level: O2

void mmt_check_eor(uint size)

{
  byte bVar1;
  
  bVar1 = mmt_buf[(mmt_idx + size) - 1];
  if (bVar1 == 10) {
    return;
  }
  fflush(_stdout);
  fprintf(_stderr,"message does not end with EOR byte: 0x%02x\n",(ulong)(uint)bVar1);
  mmt_dump_next();
  exit(1);
}

Assistant:

void mmt_check_eor(unsigned int size)
{
	uint8_t e = mmt_buf[mmt_idx + size - 1];
	if (e != EOR)
	{
		fflush(stdout);
		fprintf(stderr, "message does not end with EOR byte: 0x%02x\n", e);
		mmt_dump_next();
		exit(1);
	}
}